

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

void __thiscall
PlanningUnitMADPDiscrete::GetJointActionObservationHistoryArrays
          (PlanningUnitMADPDiscrete *this,LIndex jaohI,Index t,Index *jaIs,Index *joIs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Index IVar3;
  const_reference pvVar4;
  size_t nrO;
  size_t nrA;
  ulong uVar5;
  ulong i;
  long in_RCX;
  uint in_EDX;
  size_type in_RSI;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *in_RDI;
  long in_R8;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 in_ZMM1 [64];
  LIndex jaoI_t2;
  size_t b;
  size_t stage;
  Index t2;
  size_t nrJAO;
  size_t nrJA;
  size_t nrJO;
  size_t vec_size;
  LIndex remainder;
  LIndex jaohIwithinThisT;
  undefined4 local_5c;
  undefined8 local_38;
  
  pvVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at(in_RDI,in_RSI);
  local_38 = in_RSI - *pvVar4;
  nrO = GetNrJointObservations((PlanningUnitMADPDiscrete *)0x9d6026);
  nrA = GetNrJointActions((PlanningUnitMADPDiscrete *)0x9d6035);
  for (local_5c = 0; local_5c < in_EDX; local_5c = local_5c + 1) {
    auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,nrO * nrA);
    auVar2 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,(ulong)(~local_5c + in_EDX));
    in_ZMM1 = ZEXT1664(auVar2);
    in_ZMM0._0_8_ = pow(auVar1._0_8_,auVar2._0_8_);
    in_ZMM0._8_56_ = extraout_var;
    uVar5 = vcvttsd2usi_avx512f(in_ZMM0._0_16_);
    i = local_38 / uVar5;
    local_38 = local_38 - i * uVar5;
    IVar3 = Globals::CastLIndexToIndex(i);
    IVar3 = IndexTools::ActionObservation_to_ActionIndex(IVar3,nrA,nrO);
    *(Index *)(in_RCX + (ulong)local_5c * 4) = IVar3;
    IVar3 = Globals::CastLIndexToIndex(i);
    IVar3 = IndexTools::ActionObservation_to_ObservationIndex(IVar3,nrA,nrO);
    *(Index *)(in_R8 + (ulong)local_5c * 4) = IVar3;
  }
  return;
}

Assistant:

void 
PlanningUnitMADPDiscrete::GetJointActionObservationHistoryArrays
    (LIndex jaohI, Index t,  Index jaIs[], Index joIs[]) const
{
    //substract the offset to find out what is the index within the time-step-t-
    //observation-histories.
    LIndex jaohIwithinThisT = jaohI - _m_firstJAOHIforT.at(t);
   
    LIndex remainder = jaohIwithinThisT;
    size_t vec_size = t; // the number of 'JAO' we are searching
        //note: this was t+1, but that is incorrect(?)!
        
    size_t nrJO = GetNrJointObservations();
    size_t nrJA = GetNrJointActions();
    size_t nrJAO = nrJO*nrJA;
//    Index jao_array[vec_size];
    for(Index t2=0; t2 < vec_size ; t2++)
    {
        // suppose we have a jaoh = < jaoI[3], jaoI[2], jao[1], jaoI[0] >
        // (the numbers represent the stage of the jaoI)
        // ->then this history is for stage 4 (we have that t=4).
        //
        // the jaohI is generated by: 
        //      jaohI= jaoI[3] * nrJAO^3 + ... +jaoI[0] * nrJAO^0
        //
        // we reconstruct this by performing
        // jaoI[3] = jaohI /  nrJAO^3
        // remainder = jaohI - (jaoI^3)
        // jaoI[2] = remainder / nrJAO^2
        // etc.
        //
        // we start with stage
        size_t stage = (t-1) - t2;
        //we are going to calculate the joa that took place at time stage
        size_t b = (size_t) pow((double)nrJAO, (double)(stage));

        LIndex jaoI_t2 = remainder / b;
//        jao_array[t2] = jaoI_t2;
        remainder -= jaoI_t2 * b;

        jaIs[t2] = IndexTools::
            ActionObservation_to_ActionIndex(CastLIndexToIndex(jaoI_t2), nrJA, nrJO);
        joIs[t2] = IndexTools::
            ActionObservation_to_ObservationIndex(CastLIndexToIndex(jaoI_t2), nrJA, nrJO);
    }

}